

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O1

bool capnp::compiler::anon_unknown_0::checkChange
               (Reader file1,Reader file2,ChangeKind changeKind,uint sharedOrdinalCount)

{
  Reader file;
  Reader file_00;
  MessageBuilder *pMVar1;
  MessageBuilder *pMVar2;
  Disposer *pDVar3;
  undefined8 uVar4;
  MallocMessageBuilder *pMVar5;
  ExceptionCallback *pEVar6;
  int line;
  byte bVar7;
  char *condition;
  char *in_R9;
  Exception *e;
  anon_union_400_1_a8c68091_for_NullableValue<kj::Exception>_2 *paVar8;
  Own<capnp::MallocMessageBuilder,_std::nullptr_t> OVar9;
  SchemaLoader loader;
  Maybe<kj::Exception> exception;
  SegmentReader *params;
  Maybe<kj::Own<capnp::MallocMessageBuilder,_std::nullptr_t>_> local_3c8;
  Fault local_3b0;
  undefined1 local_3a4 [4];
  DebugComparison<kj::Maybe<kj::Exception>_&,_const_kj::None_&> local_3a0;
  SchemaLoader local_378;
  Maybe<kj::Exception> local_350;
  Maybe<kj::Exception> local_1b8;
  
  condition = (char *)(ulong)sharedOrdinalCount;
  local_3c8.ptr.disposer = (Disposer *)0x0;
  local_3c8.ptr.ptr = (MallocMessageBuilder *)0x0;
  local_3a4 = (undefined1  [4])changeKind;
  if (changeKind != INCOMPATIBLE) {
    OVar9 = kj::heap<capnp::MallocMessageBuilder>();
    uVar4 = local_350.ptr.field_1.value.ownFile.content.ptr;
    pDVar3 = local_3c8.ptr.disposer;
    local_350.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_3c8.ptr.disposer = (Disposer *)CONCAT44(local_350.ptr._4_4_,local_350.ptr._0_4_);
    pMVar5 = (MallocMessageBuilder *)uVar4;
    if (local_3c8.ptr.ptr != (MallocMessageBuilder *)0x0) {
      pMVar1 = &(local_3c8.ptr.ptr)->super_MessageBuilder;
      pMVar2 = &(local_3c8.ptr.ptr)->super_MessageBuilder;
      local_3c8.ptr.ptr = (MallocMessageBuilder *)uVar4;
      (**pDVar3->_vptr_Disposer)
                (pDVar3,(code *)((long)pMVar2->arenaSpace +
                                (long)(pMVar1->_vptr_MessageBuilder[-2] + -8)),OVar9.ptr);
      pMVar5 = local_3c8.ptr.ptr;
    }
    local_3c8.ptr.ptr = pMVar5;
    uVar4 = local_350.ptr.field_1.value.ownFile.content.ptr;
    if ((MallocMessageBuilder *)local_350.ptr.field_1.value.ownFile.content.ptr !=
        (MallocMessageBuilder *)0x0) {
      local_350.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      (*(code *)**(undefined8 **)CONCAT44(local_350.ptr._4_4_,local_350.ptr._0_4_))
                ((undefined8 *)CONCAT44(local_350.ptr._4_4_,local_350.ptr._0_4_),
                 (char *)(uVar4 + *(long *)(*(long *)uVar4 + -0x10)));
    }
  }
  SchemaLoader::SchemaLoader(&local_378);
  file._reader.capTable = file1._reader.capTable;
  file._reader.segment = file1._reader.segment;
  file._reader.data = file1._reader.data;
  file._reader.pointers = file1._reader.pointers;
  file._reader.dataSize = file1._reader.dataSize;
  file._reader.pointerCount = file1._reader.pointerCount;
  file._reader._38_2_ = file1._reader._38_2_;
  file._reader.nestingLimit = file1._reader.nestingLimit;
  file._reader._44_4_ = file1._reader._44_4_;
  loadFile(&local_1b8,file,&local_378,true,&local_3c8,sharedOrdinalCount);
  if (local_1b8.ptr.isSet == true) {
    kj::Exception::~Exception(&local_1b8.ptr.field_1.value);
  }
  file_00._reader.capTable = file2._reader.capTable;
  file_00._reader.segment = file2._reader.segment;
  file_00._reader.data = file2._reader.data;
  file_00._reader.pointers = file2._reader.pointers;
  file_00._reader.dataSize = file2._reader.dataSize;
  file_00._reader.pointerCount = file2._reader.pointerCount;
  file_00._reader._38_2_ = file2._reader._38_2_;
  file_00._reader.nestingLimit = file2._reader.nestingLimit;
  file_00._reader._44_4_ = file2._reader._44_4_;
  params = file2._reader.segment;
  loadFile(&local_350,file_00,&local_378,false,&local_3c8,sharedOrdinalCount);
  if (local_3a4 == (undefined1  [4])0x2) {
    local_3a0.right = (None *)&kj::none;
    local_3a0.op.content.ptr = " != ";
    local_3a0.op.content.size_ = 5;
    local_3a0.result = local_350.ptr.isSet;
    local_3a0.left = &local_350;
    if (local_350.ptr.isSet == false) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Exception>&,kj::None_const&>&,capnp::compiler::ParsedFile::Reader&,capnp::compiler::ParsedFile::Reader&>
                (&local_3b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                 ,0x2eb,FAILED,"exception != kj::none","_kjCondition,file1, file2",&local_3a0,&file1
                 ,&file2);
      kj::_::Debug::Fault::fatal(&local_3b0);
    }
  }
  else {
    if (local_3a4 != (undefined1  [4])0x1) {
      local_3a0.left = (Maybe<kj::Exception> *)local_3a4;
      local_3a0.right = (None *)CONCAT44(local_3a0.right._4_4_,3);
      local_3a0.op.content.ptr = " == ";
      local_3a0.op.content.size_ = 5;
      local_3a0.result = local_3a4 == (undefined1  [4])0x3;
      if (!local_3a0.result) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::compiler::(anonymous_namespace)::ChangeKind&,capnp::compiler::(anonymous_namespace)::ChangeKind>&>
                  (&local_3b0,(char *)&local_3a0,line,0x1c45cb,condition,in_R9,
                   (DebugComparison<capnp::compiler::(anonymous_namespace)::ChangeKind_&,_capnp::compiler::(anonymous_namespace)::ChangeKind>
                    *)params);
        kj::_::Debug::Fault::fatal(&local_3b0);
      }
      bVar7 = 1;
      goto LAB_0011023d;
    }
    paVar8 = (anon_union_400_1_a8c68091_for_NullableValue<kj::Exception>_2 *)0x0;
    if (local_350.ptr.isSet != false) {
      paVar8 = &local_350.ptr.field_1;
    }
    bVar7 = local_350.ptr.isSet ^ 1;
    if (bVar7 != 0) goto LAB_0011023d;
    pEVar6 = kj::getExceptionCallback();
    (*pEVar6->_vptr_ExceptionCallback[3])(pEVar6,paVar8);
  }
  bVar7 = 0;
LAB_0011023d:
  if (local_350.ptr.isSet == true) {
    kj::Exception::~Exception(&local_350.ptr.field_1.value);
  }
  SchemaLoader::~SchemaLoader(&local_378);
  pMVar5 = local_3c8.ptr.ptr;
  if (local_3c8.ptr.ptr != (MallocMessageBuilder *)0x0) {
    local_3c8.ptr.ptr = (MallocMessageBuilder *)0x0;
    (**(local_3c8.ptr.disposer)->_vptr_Disposer)
              (local_3c8.ptr.disposer,
               (code *)((long)(pMVar5->super_MessageBuilder).arenaSpace +
                       (long)((pMVar5->super_MessageBuilder)._vptr_MessageBuilder[-2] + -8)));
  }
  return (bool)bVar7;
}

Assistant:

bool checkChange(ParsedFile::Reader file1, ParsedFile::Reader file2, ChangeKind changeKind,
                 uint sharedOrdinalCount) {
  // Try loading file1 followed by file2 into the same SchemaLoader, expecting it to behave
  // according to changeKind.  Returns true if the files are both expected to be compatible and
  // actually are -- the main loop uses this to decide which version to keep

  kj::Maybe<kj::Own<MallocMessageBuilder>> exampleBuilder;

  if (changeKind != INCOMPATIBLE) {
    // For COMPATIBLE and SUBTLY_COMPATIBLE changes, build an example message with one schema
    // and check it with the other.
    exampleBuilder = kj::heap<MallocMessageBuilder>();
  }

  SchemaLoader loader;
  loadFile(file1, loader, true, exampleBuilder, sharedOrdinalCount);
  auto exception = loadFile(file2, loader, false, exampleBuilder, sharedOrdinalCount);

  if (changeKind == COMPATIBLE) {
    KJ_IF_SOME(e, exception) {
      kj::getExceptionCallback().onFatalException(kj::mv(e));
      return false;
    } else {
      return true;
    }
  } else if (changeKind == INCOMPATIBLE) {
    KJ_ASSERT(exception != kj::none, file1, file2);
    return false;
  } else {
    KJ_ASSERT(changeKind == SUBTLY_COMPATIBLE);

    // SchemaLoader is allowed to throw an exception in this case, but we ignore it.
    return true;
  }
}